

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> __thiscall
cmake::CreateGlobalGenerator(cmake *this,string *gname,bool allowArch)

{
  cmExternalMakefileProjectGeneratorFactory *this_00;
  pointer pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  pointer pcVar5;
  undefined4 in_ECX;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__y;
  undefined8 globalGenerator;
  bool bVar6;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *generator;
  string fullName;
  RegisteredGeneratorsVector *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  generators;
  undefined1 local_d8 [32];
  _Alloc_hider local_b8;
  undefined4 local_ac;
  string *local_a8;
  string local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  pointer local_68;
  pointer local_60;
  pair<std::unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  local_ac._0_1_ = (undefined1)in_ECX;
  __y = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT71(in_register_00000011,allowArch);
  pcVar5 = *(pointer *)((long)&gname->field_2 + 8);
  local_68 = gname[1]._M_dataplus._M_p;
  local_a8 = gname;
  if (pcVar5 != local_68) {
    local_ac = in_ECX;
    do {
      this_00 = *(cmExternalMakefileProjectGeneratorFactory **)pcVar5;
      local_60 = pcVar5;
      cmExternalMakefileProjectGeneratorFactory::GetSupportedGlobalGenerators_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_80,this_00);
      cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_((string *)local_d8,this_00);
      uVar2 = local_d8._0_8_;
      if (local_d8._8_8_ == __y->_M_string_length) {
        if (local_d8._8_8_ == 0) {
          bVar6 = true;
        }
        else {
          iVar4 = bcmp((void *)local_d8._0_8_,(__y->_M_dataplus)._M_p,local_d8._8_8_);
          bVar6 = iVar4 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if ((cmGlobalGenerator *)uVar2 != (cmGlobalGenerator *)(local_d8 + 0x10)) {
        operator_delete((void *)uVar2,local_d8._16_8_ + 1);
      }
      uVar2 = local_80._8_8_;
      globalGenerator = local_80._M_allocated_capacity;
      if (bVar6) {
        (*this_00->_vptr_cmExternalMakefileProjectGeneratorFactory[2])(local_d8,this_00);
        if (local_80._8_8_ == local_80._M_allocated_capacity) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
        }
        std::
        pair<std::unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>,_true>
                  (&local_58,
                   (unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
                    *)local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_80._M_allocated_capacity);
        if ((cmGlobalGenerator *)local_d8._0_8_ != (cmGlobalGenerator *)0x0) {
          (**(code **)(*(long *)local_d8._0_8_ + 8))();
        }
LAB_001cd3d8:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_80);
        goto LAB_001cd3e2;
      }
      for (; globalGenerator != uVar2; globalGenerator = (string *)(globalGenerator + 0x20)) {
        cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_a0,this_00);
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                  ((string *)local_d8,(string *)globalGenerator,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        uVar3 = local_d8._0_8_;
        if (local_d8._8_8_ == __y->_M_string_length) {
          if (local_d8._8_8_ != 0) {
            iVar4 = bcmp((void *)local_d8._0_8_,(__y->_M_dataplus)._M_p,local_d8._8_8_);
            if (iVar4 != 0) goto LAB_001cd31c;
          }
          (*this_00->_vptr_cmExternalMakefileProjectGeneratorFactory[2])(&local_a0,this_00);
          std::
          pair<std::unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>,_true>
                    (&local_58,
                     (unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
                      *)&local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     globalGenerator);
          if ((long *)local_a0._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_a0._M_dataplus._M_p + 8))();
          }
          if ((cmGlobalGenerator *)local_d8._0_8_ != (cmGlobalGenerator *)(local_d8 + 0x10)) {
            operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
          }
          goto LAB_001cd3d8;
        }
LAB_001cd31c:
        if ((cmGlobalGenerator *)uVar3 != (cmGlobalGenerator *)(local_d8 + 0x10)) {
          operator_delete((void *)uVar3,local_d8._16_8_ + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_80);
      pcVar5 = local_60 + 8;
    } while (pcVar5 != local_68);
  }
  local_d8._0_8_ = (cmGlobalGenerator *)0x0;
  std::
  pair<std::unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::nullptr_t,_true>(&local_58,(void **)local_d8,__y);
LAB_001cd3e2:
  (this->Generators).
  super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pcVar5 = (local_a8->_M_dataplus)._M_p;
  pcVar1 = (pointer)local_a8->_M_string_length;
  if (pcVar5 != pcVar1) {
    do {
      (**(code **)(**(long **)pcVar5 + 0x10))
                (local_d8,*(long **)pcVar5,&local_58.second,(undefined1)local_ac,local_a8);
      if ((cmGlobalGenerator *)local_d8._0_8_ != (cmGlobalGenerator *)0x0) {
        (this->Generators).
        super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_d8._0_8_;
        local_b8._M_p =
             (pointer)local_58.first._M_t.
                      super___uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmExternalMakefileProjectGenerator_*,_std::default_delete<cmExternalMakefileProjectGenerator>_>
                      .super__Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>.
                      _M_head_impl;
        local_58.first._M_t.
        super___uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmExternalMakefileProjectGenerator_*,_std::default_delete<cmExternalMakefileProjectGenerator>_>
        .super__Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>._M_head_impl =
             (__uniq_ptr_data<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>,_true,_true>
              )(__uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
                )0x0;
        cmGlobalGenerator::SetExternalMakefileProjectGenerator
                  ((cmGlobalGenerator *)local_d8._0_8_,
                   (unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
                    *)&local_b8);
        if ((long *)local_b8._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_b8._M_p + 8))();
        }
        local_b8._M_p = (pointer)0x0;
        goto LAB_001cd48a;
      }
      pcVar5 = pcVar5 + 8;
    } while (pcVar5 != pcVar1);
  }
  (this->Generators).
  super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_001cd48a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.second._M_dataplus._M_p != &local_58.second.field_2) {
    operator_delete(local_58.second._M_dataplus._M_p,
                    local_58.second.field_2._M_allocated_capacity + 1);
  }
  if ((_Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>)
      local_58.first._M_t.
      super___uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmExternalMakefileProjectGenerator_*,_std::default_delete<cmExternalMakefileProjectGenerator>_>
      .super__Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>._M_head_impl !=
      (_Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_58.first._M_t.
        super___uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmExternalMakefileProjectGenerator_*,_std::default_delete<cmExternalMakefileProjectGenerator>_>
        .super__Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>._M_head_impl)[1])();
  }
  return (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
         (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<cmGlobalGenerator> cmake::CreateGlobalGenerator(
  const std::string& gname, bool allowArch)
{
  std::pair<std::unique_ptr<cmExternalMakefileProjectGenerator>, std::string>
    extra = createExtraGenerator(this->ExtraGenerators, gname);
  std::unique_ptr<cmExternalMakefileProjectGenerator>& extraGenerator =
    extra.first;
  const std::string& name = extra.second;

  std::unique_ptr<cmGlobalGenerator> generator;
  for (const auto& g : this->Generators) {
    generator = g->CreateGlobalGenerator(name, allowArch, this);
    if (generator) {
      break;
    }
  }

  if (generator) {
    generator->SetExternalMakefileProjectGenerator(std::move(extraGenerator));
  }

  return generator;
}